

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O0

void __thiscall
soul::heart::Printer::PrinterStream::printDescription(PrinterStream *this,FunctionCall *f)

{
  bool bVar1;
  Expression *e;
  CodePrinter *this_00;
  Function *f_00;
  ArrayView<soul::pool_ref<soul::heart::Expression>_> local_58 [2];
  string local_38;
  FunctionCall *local_18;
  FunctionCall *f_local;
  PrinterStream *this_local;
  
  local_18 = f;
  f_local = (FunctionCall *)this;
  bVar1 = pool_ptr<soul::heart::Expression>::operator!=(&(f->super_Assignment).target,(void *)0x0);
  if (bVar1) {
    e = pool_ptr<soul::heart::Expression>::operator*(&(local_18->super_Assignment).target);
    printAssignmentSyntax(this,e);
  }
  this_00 = choc::text::CodePrinter::operator<<(this->out,"call ");
  f_00 = FunctionCall::getFunction(local_18);
  getFunctionName_abi_cxx11_(&local_38,this,f_00);
  choc::text::CodePrinter::operator<<(this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  ArrayView<soul::pool_ref<soul::heart::Expression>>::
  ArrayView<soul::ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,4ul>>
            ((ArrayView<soul::pool_ref<soul::heart::Expression>> *)local_58,&local_18->arguments);
  printArgList(this,local_58);
  return;
}

Assistant:

void printDescription (const heart::FunctionCall& f)
        {
            if (f.target != nullptr)
                printAssignmentSyntax (*f.target);

            out << "call " << getFunctionName (f.getFunction());
            printArgList (f.arguments);
        }